

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_gmdate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zIn;
  tm *ptVar2;
  tm *pTm_1;
  time_t t_1;
  time_t t;
  tm *pTm;
  Sytm sTm;
  int nLen;
  char *zFormat;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zIn = jx9_value_to_string(*apArg,(int *)((long)&sTm.tm_gmtoff + 4));
    if (sTm.tm_gmtoff._4_4_ < 1) {
      jx9_result_string(pCtx,"",0);
    }
    if (nArg < 2) {
      time(&t_1);
      t = (time_t)gmtime(&t_1);
      sTm.tm_sec = ((tm *)t)->tm_hour;
      pTm._4_4_ = ((tm *)t)->tm_min;
      pTm._0_4_ = ((tm *)t)->tm_sec;
      sTm.tm_hour = ((tm *)t)->tm_mon;
      sTm.tm_min = ((tm *)t)->tm_mday;
      iVar1 = ((tm *)t)->tm_year;
      sTm.tm_year = ((tm *)t)->tm_yday;
      sTm.tm_mon = ((tm *)t)->tm_wday;
      sTm.tm_wday = ((tm *)t)->tm_isdst;
    }
    else {
      iVar1 = jx9_value_is_int(apArg[1]);
      if (iVar1 == 0) {
        time((time_t *)&pTm_1);
      }
      else {
        pTm_1 = (tm *)jx9_value_to_int64(apArg[1]);
        ptVar2 = gmtime((time_t *)&pTm_1);
        if (ptVar2 == (tm *)0x0) {
          time((time_t *)&pTm_1);
        }
      }
      ptVar2 = gmtime((time_t *)&pTm_1);
      sTm.tm_sec = ptVar2->tm_hour;
      pTm._4_4_ = ptVar2->tm_min;
      pTm._0_4_ = ptVar2->tm_sec;
      sTm.tm_hour = ptVar2->tm_mon;
      sTm.tm_min = ptVar2->tm_mday;
      iVar1 = ptVar2->tm_year;
      sTm.tm_year = ptVar2->tm_yday;
      sTm.tm_mon = ptVar2->tm_wday;
      sTm.tm_wday = ptVar2->tm_isdst;
    }
    sTm.tm_mday = iVar1 + 0x76c;
    sTm.tm_zone = (char *)0x0;
    sTm.tm_isdst = 0;
    sTm._36_4_ = 0;
    DateFormat(pCtx,zIn,sTm.tm_gmtoff._4_4_,(Sytm *)&pTm);
  }
  return 0;
}

Assistant:

static int jx9Builtin_gmdate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return the empty string */
		jx9_result_string(pCtx, "", 0);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = gmtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = gmtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = gmtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Format the given string */
	DateFormat(pCtx, zFormat, nLen, &sTm);
	return JX9_OK;
}